

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::TracingServiceState_TracingSession::TracingServiceState_TracingSession
          (TracingServiceState_TracingSession *this,TracingServiceState_TracingSession *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int64_t iVar4;
  uint32_t uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TracingServiceState_TracingSession_003c7200;
  this->id_ = param_2->id_;
  this->consumer_uid_ = param_2->consumer_uid_;
  paVar1 = &(this->state_).field_2;
  (this->state_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_2->state_)._M_dataplus._M_p;
  paVar6 = &(param_2->state_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar6) {
    uVar3 = *(undefined8 *)((long)&(param_2->state_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar6->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->state_).field_2 + 8) = uVar3;
  }
  else {
    (this->state_)._M_dataplus._M_p = pcVar2;
    (this->state_).field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  (this->state_)._M_string_length = (param_2->state_)._M_string_length;
  (param_2->state_)._M_dataplus._M_p = (pointer)paVar6;
  (param_2->state_)._M_string_length = 0;
  (param_2->state_).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->unique_session_name_).field_2;
  (this->unique_session_name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_2->unique_session_name_)._M_dataplus._M_p;
  paVar6 = &(param_2->unique_session_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar6) {
    uVar3 = *(undefined8 *)((long)&(param_2->unique_session_name_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar6->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->unique_session_name_).field_2 + 8) = uVar3;
  }
  else {
    (this->unique_session_name_)._M_dataplus._M_p = pcVar2;
    (this->unique_session_name_).field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  (this->unique_session_name_)._M_string_length = (param_2->unique_session_name_)._M_string_length;
  (param_2->unique_session_name_)._M_dataplus._M_p = (pointer)paVar6;
  (param_2->unique_session_name_)._M_string_length = 0;
  (param_2->unique_session_name_).field_2._M_local_buf[0] = '\0';
  (this->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_2->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_2->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_2->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_2->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar5 = param_2->num_data_sources_;
  iVar4 = param_2->start_realtime_ns_;
  this->duration_ms_ = param_2->duration_ms_;
  this->num_data_sources_ = uVar5;
  this->start_realtime_ns_ = iVar4;
  paVar1 = &(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_2->unknown_fields_)._M_dataplus._M_p;
  paVar6 = &(param_2->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar6) {
    uVar3 = *(undefined8 *)((long)&(param_2->unknown_fields_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar6->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->unknown_fields_).field_2 + 8) = uVar3;
  }
  else {
    (this->unknown_fields_)._M_dataplus._M_p = pcVar2;
    (this->unknown_fields_).field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  (this->unknown_fields_)._M_string_length = (param_2->unknown_fields_)._M_string_length;
  (param_2->unknown_fields_)._M_dataplus._M_p = (pointer)paVar6;
  (param_2->unknown_fields_)._M_string_length = 0;
  (param_2->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_2->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

TracingServiceState_TracingSession::TracingServiceState_TracingSession(TracingServiceState_TracingSession&&) noexcept = default;